

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O3

void __thiscall cs::statement_while::run_impl(statement_while *this)

{
  bool bVar1;
  element_type *peVar2;
  stack_pointer psVar3;
  _Elt_pointer ppsVar4;
  statement_base *psVar5;
  undefined *puVar6;
  bool *pbVar7;
  _Map_pointer pppsVar8;
  stack_pointer this_00;
  _Elt_pointer ppsVar9;
  _Elt_pointer ppsVar10;
  scope_guard scope;
  scope_guard local_b0;
  context_t *local_a8;
  slot_type *local_98;
  
  peVar2 = (((this->super_statement_base).context.
             super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->instance).
           super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar2->break_block == true) {
    peVar2->break_block = false;
  }
  local_b0.context = &(this->super_statement_base).context;
  if (peVar2->continue_block == true) {
    peVar2->continue_block = false;
  }
  psVar3 = *(peVar2->super_runtime_type).storage.fiber_stack;
  this_00 = &(peVar2->super_runtime_type).storage.m_data;
  if (psVar3 != (stack_pointer)0x0) {
    this_00 = psVar3;
  }
  local_a8 = local_b0.context;
  stack_type<cs::domain_type,_std::allocator>::push<>(this_00);
  do {
    local_98 = (slot_type *)(this->mTree).mRoot;
    runtime_type::parse_expr
              ((runtime_type *)&stack0xffffffffffffff60,
               (iterator *)
               (((this->super_statement_base).context.
                 super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->instance)
               .super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               SUB81(&stack0xffffffffffffff68,0));
    pbVar7 = cs_impl::any::const_val<bool>((any *)&stack0xffffffffffffff60);
    bVar1 = *pbVar7;
    cs_impl::any::recycle((any *)&stack0xffffffffffffff60);
    puVar6 = current_process;
    if (bVar1 != true) {
LAB_00168cba:
      scope_guard::~scope_guard(&local_b0);
      return;
    }
    if ((*current_process & 1) != 0) {
      LOCK();
      *current_process = 0;
      UNLOCK();
      event_type::touch((event_type *)(puVar6 + 0xd0),(void *)0x0);
    }
    ppsVar10 = (this->mBlock).
               super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
               _M_impl.super__Deque_impl_data._M_start._M_cur;
    ppsVar4 = (this->mBlock).
              super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>._M_impl
              .super__Deque_impl_data._M_finish._M_cur;
    if (ppsVar10 != ppsVar4) {
      ppsVar9 = (this->mBlock).
                super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
                _M_impl.super__Deque_impl_data._M_start._M_last;
      pppsVar8 = (this->mBlock).
                 super__Deque_base<cs::statement_base_*,_std::allocator<cs::statement_base_*>_>.
                 _M_impl.super__Deque_impl_data._M_start._M_node;
      do {
        puVar6 = current_process;
        psVar5 = *ppsVar10;
        if ((*current_process & 1) != 0) {
          LOCK();
          *current_process = 0;
          UNLOCK();
          event_type::touch((event_type *)(puVar6 + 0xd0),(void *)0x0);
        }
        (*psVar5->_vptr_statement_base[3])(psVar5);
        peVar2 = (((local_a8->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->instance).
                 super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if (peVar2->return_fcall != false) goto LAB_00168cba;
        if (peVar2->break_block == true) {
          peVar2->break_block = false;
          goto LAB_00168cba;
        }
        if (peVar2->continue_block != false) {
          peVar2->continue_block = false;
          break;
        }
        ppsVar10 = ppsVar10 + 1;
        if (ppsVar10 == ppsVar9) {
          ppsVar10 = pppsVar8[1];
          pppsVar8 = pppsVar8 + 1;
          ppsVar9 = ppsVar10 + 0x40;
        }
      } while (ppsVar10 != ppsVar4);
    }
    domain_manager::next_domain
              (&((((((local_b0.context)->
                    super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                  instance).super___shared_ptr<cs::instance_type,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 )->super_runtime_type).storage);
  } while( true );
}

Assistant:

void statement_while::run_impl()
	{
		CS_DEBUGGER_STEP(this);
		if (context->instance->break_block)
			context->instance->break_block = false;
		if (context->instance->continue_block)
			context->instance->continue_block = false;
		scope_guard scope(context);
		while (context->instance->parse_expr(mTree.root()).const_val<boolean>()) {
			current_process->poll_event();
			for (auto &ptr: mBlock) {
				try {
					ptr->run();
				}
				catch (const cs::exception &e) {
					throw e;
				}
				catch (const std::exception &e) {
					throw exception(ptr->get_line_num(), ptr->get_file_path(), ptr->get_raw_code(), e.what());
				}
				if (context->instance->return_fcall) {
					return;
				}
				if (context->instance->break_block) {
					context->instance->break_block = false;
					return;
				}
				if (context->instance->continue_block) {
					context->instance->continue_block = false;
					break;
				}
			}
			scope.clear();
		}
	}